

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O2

void cmsysProcess_Execute(cmsysProcess *cp)

{
  int *p_00;
  pid_t *__ptr;
  cmsysProcess **__src;
  int iVar1;
  int iVar2;
  __pid_t _Var3;
  __pid_t _Var4;
  long lVar5;
  pid_t *ppVar6;
  int *piVar7;
  kwsysProcessResults *pkVar8;
  char *pcVar9;
  cmsysProcess **__dest;
  ssize_t sVar10;
  int *piVar11;
  int *piVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  kwsysProcessTime kVar17;
  int nextStdIn;
  int local_20c;
  int local_208;
  int iStack_204;
  int iStack_200;
  int iStack_1fc;
  int pgidPipe [2];
  int local_1cc;
  int p [2];
  sigset_t local_1c0;
  int local_140;
  sigset_t mask;
  sigset_t old_mask;
  
  if (cp == (cmsysProcess *)0x0) {
    return;
  }
  if (cp->State == 3) {
    return;
  }
  if (cp->NumberOfCommands < 1) {
    builtin_strncpy(cp->ErrorMessage,"No command",0xb);
    goto LAB_00533b81;
  }
  for (lVar5 = 3; lVar5 != 6; lVar5 = lVar5 + 1) {
    cp->PipeReadEnds[lVar5 + -3] = -1;
  }
  piVar12 = cp->PipeChildStd;
  for (lVar5 = 6; lVar5 != 9; lVar5 = lVar5 + 1) {
    cp->PipeReadEnds[lVar5 + -3] = -1;
  }
  cp->SignalPipe = -1;
  cp->SelectError = 0;
  *(undefined4 *)&(cp->StartTime).tv_sec = 0xffffffff;
  *(undefined4 *)((long)&(cp->StartTime).tv_sec + 4) = 0xffffffff;
  *(undefined4 *)&(cp->StartTime).tv_usec = 0xffffffff;
  *(undefined4 *)((long)&(cp->StartTime).tv_usec + 4) = 0xffffffff;
  *(undefined4 *)&(cp->TimeoutTime).tv_sec = 0xffffffff;
  *(undefined4 *)((long)&(cp->TimeoutTime).tv_sec + 4) = 0xffffffff;
  *(undefined4 *)&(cp->TimeoutTime).tv_usec = 0xffffffff;
  *(undefined4 *)((long)&(cp->TimeoutTime).tv_usec + 4) = 0xffffffff;
  cp->TimeoutExpired = 0;
  cp->PipesLeft = 0;
  cp->CommandsLeft = 0;
  for (lVar5 = 0x91; lVar5 != 0xa1; lVar5 = lVar5 + 1) {
    (cp->PipeReadEnds + lVar5 * 2 + -3)[0] = 0;
    (cp->PipeReadEnds + lVar5 * 2 + -3)[1] = 0;
  }
  cp->State = 0;
  cp->Killed = 0;
  cp->ErrorMessage[0] = '\0';
  __ptr = cp->ForkPIDs;
  ppVar6 = (pid_t *)malloc((long)cp->NumberOfCommands << 2);
  cp->ForkPIDs = ppVar6;
  free(__ptr);
  if (cp->ForkPIDs != (pid_t *)0x0) {
    for (lVar5 = 0; lVar5 < cp->NumberOfCommands; lVar5 = lVar5 + 1) {
      cp->ForkPIDs[lVar5] = 0;
    }
    free(cp->CommandExitCodes);
    piVar7 = (int *)malloc((long)cp->NumberOfCommands << 2);
    cp->CommandExitCodes = piVar7;
    if (piVar7 != (int *)0x0) {
      memset(piVar7,0,(long)cp->NumberOfCommands << 2);
      free(cp->ProcessResults);
      pkVar8 = (kwsysProcessResults *)malloc((long)cp->NumberOfCommands * 0x414);
      cp->ProcessResults = pkVar8;
      if (pkVar8 != (kwsysProcessResults *)0x0) {
        memset(pkVar8,0,(long)cp->NumberOfCommands * 0x414);
        lVar5 = 0x10;
        for (lVar13 = 0; lVar13 < cp->NumberOfCommands; lVar13 = lVar13 + 1) {
          pkVar8 = cp->ProcessResults;
          pcVar9 = pkVar8->ExitExceptionString + lVar5 + -0x20;
          pcVar9[0] = '\0';
          pcVar9[1] = '\0';
          pcVar9[2] = '\0';
          pcVar9[3] = '\0';
          pcVar9[4] = '\0';
          pcVar9[5] = '\0';
          pcVar9[6] = '\0';
          pcVar9[7] = '\0';
          pcVar9[8] = '\x01';
          pcVar9[9] = '\0';
          pcVar9[10] = '\0';
          pcVar9[0xb] = '\0';
          pcVar9[0xc] = '\x01';
          pcVar9[0xd] = '\0';
          pcVar9[0xe] = '\0';
          pcVar9[0xf] = '\0';
          pcVar9 = pkVar8->ExitExceptionString + lVar5 + -0x10;
          pcVar9[0] = 'N';
          pcVar9[1] = 'o';
          pcVar9[2] = ' ';
          pcVar9[3] = 'e';
          pcVar9[4] = 'x';
          pcVar9[5] = 'c';
          pcVar9[6] = 'e';
          pcVar9[7] = 'p';
          pcVar9 = pkVar8->ExitExceptionString + lVar5 + -0xb;
          pcVar9[0] = 'c';
          pcVar9[1] = 'e';
          pcVar9[2] = 'p';
          pcVar9[3] = 't';
          pcVar9[4] = 'i';
          pcVar9[5] = 'o';
          pcVar9[6] = 'n';
          pcVar9[7] = '\0';
          lVar5 = lVar5 + 0x414;
        }
        if (cp->WorkingDirectory == (char *)0x0) {
LAB_00533b9d:
          if (cp->OptionDetach == 0) {
            iVar1 = pipe(p);
            if (iVar1 < 0) goto LAB_005344bb;
            cp->PipeReadEnds[2] = p[0];
            cp->SignalPipe = p[1];
            iVar1 = kwsysProcessSetNonBlocking(p[0]);
            if (iVar1 == 0) goto LAB_005344bb;
            iVar1 = kwsysProcessSetNonBlocking(p[1]);
            if (iVar1 == 0) goto LAB_005344bb;
            iVar1 = fcntl(p[0],2,1);
            if (iVar1 < 0) goto LAB_005344bb;
            iVar2 = fcntl(p[1],2,1);
            __src = kwsysProcesses.Processes;
            iVar1 = kwsysProcesses.Count;
            if (iVar2 < 0) goto LAB_005344bb;
            lVar5 = (long)kwsysProcesses.Count;
            mask.__val[0]._4_4_ = kwsysProcesses.Size;
            mask.__val[1] = (unsigned_long)kwsysProcesses.Processes;
            __dest = kwsysProcesses.Processes;
            if (kwsysProcesses.Count == kwsysProcesses.Size) {
              mask.__val[0]._4_4_ = kwsysProcesses.Count * 2;
              if (kwsysProcesses.Count == 0) {
                mask.__val[0]._4_4_ = 4;
              }
              __dest = (cmsysProcess **)malloc((long)mask.__val[0]._4_4_ << 3);
              mask.__val[1] = (unsigned_long)__dest;
              if (__dest == (cmsysProcess **)0x0) goto LAB_005344bb;
              if (0 < iVar1) {
                memcpy(__dest,__src,lVar5 * 8);
              }
            }
            mask.__val[0]._0_4_ = iVar1 + 1;
            __dest[lVar5] = cp;
            kwsysProcessesUpdate((kwsysProcessInstances *)&mask);
            if (__dest != __src) {
              free(__src);
            }
            if (iVar1 == 0) {
              memset(&local_1c0,0,0x90);
              p = (int  [2])kwsysProcessesSignalHandler;
              local_140 = 0x10000005;
              sigemptyset(&local_1c0);
              do {
                iVar1 = sigaction(0x11,(sigaction *)p,(sigaction *)&kwsysProcessesOldSigChldAction);
                if (-1 < iVar1) break;
                piVar7 = __errno_location();
              } while (*piVar7 == 4);
              sigemptyset(&local_1c0);
              sigaddset(&local_1c0,0xf);
              do {
                iVar1 = sigaction(2,(sigaction *)p,(sigaction *)&kwsysProcessesOldSigIntAction);
                if (-1 < iVar1) break;
                piVar7 = __errno_location();
              } while (*piVar7 == 4);
              sigemptyset(&local_1c0);
              sigaddset(&local_1c0,2);
              do {
                iVar1 = sigaction(0xf,(sigaction *)p,(sigaction *)&kwsysProcessesOldSigIntAction);
                if (-1 < iVar1) break;
                piVar7 = __errno_location();
              } while (*piVar7 == 4);
            }
          }
          if (cp->PipeFileSTDIN == (char *)0x0) {
            iVar1 = 0;
            if (cp->PipeSharedSTDIN == 0) {
              iVar1 = cp->PipeNativeSTDIN[0];
              if (-1 < iVar1) {
                *piVar12 = iVar1;
                iVar1 = fcntl(iVar1,2,1);
                if (iVar1 < 0) goto LAB_005344bb;
                iVar1 = cp->PipeNativeSTDIN[1];
                goto LAB_00533bd3;
              }
              iVar1 = -1;
            }
            *piVar12 = iVar1;
          }
          else {
            iVar1 = open(cp->PipeFileSTDIN,0);
            *piVar12 = iVar1;
            if (iVar1 < 0) goto LAB_005344bb;
LAB_00533bd3:
            iVar1 = fcntl(iVar1,2,1);
            if (iVar1 < 0) goto LAB_005344bb;
          }
          iVar1 = pipe(p);
          if (iVar1 < 0) goto LAB_005344bb;
          cp->PipeReadEnds[0] = p[0];
          cp->PipeChildStd[1] = p[1];
          iVar1 = fcntl(p[0],2,1);
          if (iVar1 < 0) goto LAB_005344bb;
          iVar1 = fcntl(p[1],2,1);
          if (iVar1 < 0) goto LAB_005344bb;
          iVar1 = kwsysProcessSetNonBlocking(p[0]);
          if (iVar1 == 0) goto LAB_005344bb;
          piVar7 = cp->PipeChildStd + 1;
          if (cp->PipeFileSTDOUT == (char *)0x0) {
            if (cp->PipeSharedSTDOUT == 0) {
              if (-1 < cp->PipeNativeSTDOUT[1]) {
                iVar1 = kwsysProcessSetupOutputPipeNative(piVar7,cp->PipeNativeSTDOUT);
                goto LAB_00533e71;
              }
            }
            else {
              kwsysProcessCleanupDescriptor(piVar7);
              *piVar7 = 1;
            }
          }
          else {
            iVar1 = kwsysProcessSetupOutputPipeFile(piVar7,cp->PipeFileSTDOUT);
LAB_00533e71:
            if (iVar1 == 0) goto LAB_005344bb;
          }
          iVar1 = pipe(p);
          if (-1 < iVar1) {
            cp->PipeReadEnds[1] = p[0];
            cp->PipeChildStd[2] = p[1];
            iVar1 = fcntl(p[0],2,1);
            if (iVar1 < 0) goto LAB_005344bb;
            iVar1 = fcntl(p[1],2,1);
            if (iVar1 < 0) goto LAB_005344bb;
            iVar1 = kwsysProcessSetNonBlocking(p[0]);
            if (iVar1 == 0) goto LAB_005344bb;
            p_00 = cp->PipeChildStd + 2;
            if (cp->PipeFileSTDERR == (char *)0x0) {
              if (cp->PipeSharedSTDERR != 0) {
                kwsysProcessCleanupDescriptor(p_00);
                *p_00 = 2;
                goto LAB_00533f90;
              }
              if (cp->PipeNativeSTDERR[1] < 0) goto LAB_00533f90;
              iVar1 = kwsysProcessSetupOutputPipeNative(p_00,cp->PipeNativeSTDERR);
            }
            else {
              iVar1 = kwsysProcessSetupOutputPipeFile(p_00,cp->PipeFileSTDERR);
            }
            if (iVar1 != 0) {
LAB_00533f90:
              kVar17 = kwsysProcessTimeGetCurrent();
              cp->StartTime = kVar17;
              *(undefined4 *)&(cp->TimeoutTime).tv_sec = 0xffffffff;
              *(undefined4 *)((long)&(cp->TimeoutTime).tv_sec + 4) = 0xffffffff;
              *(undefined4 *)&(cp->TimeoutTime).tv_usec = 0xffffffff;
              *(undefined4 *)((long)&(cp->TimeoutTime).tv_usec + 4) = 0xffffffff;
              local_208 = -1;
              iStack_204 = -1;
              iStack_200 = -1;
              iStack_1fc = -1;
              nextStdIn = cp->PipeChildStd[0];
              uVar15 = 0;
              while ((long)uVar15 < (long)cp->NumberOfCommands) {
                local_20c = nextStdIn;
                if (uVar15 != cp->NumberOfCommands - 1) {
                  p[0] = -1;
                  p[1] = -1;
                  iVar1 = pipe(p);
                  if (-1 < iVar1) {
                    iVar1 = fcntl(p[0],2,1);
                    if (-1 < iVar1) {
                      iVar1 = fcntl(p[1],2,1);
                      if (-1 < iVar1) {
                        nextStdIn = p[0];
                        local_208 = p[1];
                        goto LAB_00534061;
                      }
                    }
                    close(p[0]);
                    close(p[1]);
                  }
                  goto LAB_005344a7;
                }
                nextStdIn = -1;
                local_208 = *piVar7;
LAB_00534061:
                iStack_204 = cp->PipeChildStd[(ulong)(cp->MergeOutput == 0) + 1];
                iVar1 = pipe(&iStack_200);
                bVar16 = true;
                if (-1 < iVar1) {
                  iVar1 = pipe(pgidPipe);
                  if (iVar1 < 0) {
                    kwsysProcessCleanupDescriptor(&iStack_200);
                    kwsysProcessCleanupDescriptor(&iStack_1fc);
                  }
                  else {
                    iVar1 = fcntl(iStack_1fc,2,1);
                    if ((iVar1 < 0) || (iVar1 = fcntl(pgidPipe[1],2,1), iVar1 < 0)) {
                      kwsysProcessCleanupDescriptor(&iStack_200);
                      kwsysProcessCleanupDescriptor(&iStack_1fc);
                      kwsysProcessCleanupDescriptor(pgidPipe);
                      kwsysProcessCleanupDescriptor(pgidPipe + 1);
                    }
                    else {
                      sigemptyset((sigset_t *)&mask);
                      sigaddset((sigset_t *)&mask,2);
                      sigaddset((sigset_t *)&mask,0xf);
                      iVar1 = sigprocmask(0,(sigset_t *)&mask,(sigset_t *)&old_mask);
                      if (iVar1 < 0) {
                        kwsysProcessCleanupDescriptor(&iStack_200);
                        kwsysProcessCleanupDescriptor(&iStack_1fc);
                        kwsysProcessCleanupDescriptor(pgidPipe);
                        kwsysProcessCleanupDescriptor(pgidPipe + 1);
                      }
                      else {
                        iVar1 = cp->OptionDetach;
                        _Var3 = fork();
                        if (-1 < _Var3 && iVar1 != 0) {
                          if (_Var3 != 0) {
                            do {
                              sVar10 = read(iStack_200,p,4);
                              if (-1 < sVar10) break;
                              piVar11 = __errno_location();
                            } while (*piVar11 == 4);
                            do {
                              _Var4 = waitpid(_Var3,&local_1cc,0);
                              if (-1 < _Var4) break;
                              piVar11 = __errno_location();
                            } while (*piVar11 == 4);
                            _Var3 = p[0];
                            goto LAB_0053421e;
                          }
                          _Var3 = fork();
                          p[0] = _Var3;
                          if (_Var3 == 0) {
                            _Var3 = 0;
                            goto LAB_0053421e;
                          }
LAB_00534768:
                          goto LAB_00534771;
                        }
LAB_0053421e:
                        cp->ForkPIDs[uVar15] = _Var3;
                        if (cp->ForkPIDs[uVar15] < 0) {
                          sigprocmask(2,(sigset_t *)&old_mask,(sigset_t *)0x0);
                          kwsysProcessCleanupDescriptor(&iStack_200);
                          kwsysProcessCleanupDescriptor(&iStack_1fc);
                          kwsysProcessCleanupDescriptor(pgidPipe);
                          kwsysProcessCleanupDescriptor(pgidPipe + 1);
                        }
                        else {
                          if (cp->ForkPIDs[uVar15] == 0) {
                            close(iStack_200);
                            close(pgidPipe[0]);
                            if (local_20c < 1) {
                              if (local_20c < 0) {
                                close(0);
                              }
                            }
                            else {
                              dup2(local_20c,0);
                            }
                            if (local_208 != 1) {
                              dup2(local_208,1);
                            }
                            if (iStack_204 != 2) {
                              dup2(iStack_204,2);
                            }
                            fcntl(0,2,0);
                            fcntl(1,2,0);
                            fcntl(2,2,0);
                            memset((sigaction *)p,0,0x98);
                            sigaction(1,(sigaction *)p,(sigaction *)0x0);
                            sigaction(2,(sigaction *)p,(sigaction *)0x0);
                            sigaction(3,(sigaction *)p,(sigaction *)0x0);
                            sigaction(4,(sigaction *)p,(sigaction *)0x0);
                            sigaction(5,(sigaction *)p,(sigaction *)0x0);
                            sigaction(6,(sigaction *)p,(sigaction *)0x0);
                            sigaction(6,(sigaction *)p,(sigaction *)0x0);
                            sigaction(7,(sigaction *)p,(sigaction *)0x0);
                            sigaction(8,(sigaction *)p,(sigaction *)0x0);
                            sigaction(10,(sigaction *)p,(sigaction *)0x0);
                            sigaction(0xb,(sigaction *)p,(sigaction *)0x0);
                            sigaction(0xc,(sigaction *)p,(sigaction *)0x0);
                            sigaction(0xd,(sigaction *)p,(sigaction *)0x0);
                            sigaction(0xe,(sigaction *)p,(sigaction *)0x0);
                            sigaction(0xf,(sigaction *)p,(sigaction *)0x0);
                            sigaction(0x10,(sigaction *)p,(sigaction *)0x0);
                            sigaction(0x11,(sigaction *)p,(sigaction *)0x0);
                            sigaction(0x11,(sigaction *)p,(sigaction *)0x0);
                            sigaction(0x12,(sigaction *)p,(sigaction *)0x0);
                            sigaction(0x14,(sigaction *)p,(sigaction *)0x0);
                            sigaction(0x15,(sigaction *)p,(sigaction *)0x0);
                            sigaction(0x16,(sigaction *)p,(sigaction *)0x0);
                            sigaction(0x17,(sigaction *)p,(sigaction *)0x0);
                            sigaction(0x18,(sigaction *)p,(sigaction *)0x0);
                            sigaction(0x19,(sigaction *)p,(sigaction *)0x0);
                            sigaction(0x1a,(sigaction *)p,(sigaction *)0x0);
                            sigaction(0x1b,(sigaction *)p,(sigaction *)0x0);
                            sigaction(0x1c,(sigaction *)p,(sigaction *)0x0);
                            sigaction(0x1d,(sigaction *)p,(sigaction *)0x0);
                            sigaction(0x1d,(sigaction *)p,(sigaction *)0x0);
                            sigaction(0x1e,(sigaction *)p,(sigaction *)0x0);
                            sigaction(0x1f,(sigaction *)p,(sigaction *)0x0);
                            sigprocmask(2,(sigset_t *)&old_mask,(sigset_t *)0x0);
                            if ((cp->CreateProcessGroup == 0) || (_Var3 = setsid(), -1 < _Var3)) {
                              execvp(*cp->Commands[uVar15],cp->Commands[uVar15]);
                            }
                            kwsysProcessChildErrorExit(iStack_1fc);
                            goto LAB_00534768;
                          }
                          kwsysProcessCleanupDescriptor(&iStack_1fc);
                          kwsysProcessCleanupDescriptor(pgidPipe + 1);
                          do {
                            sVar10 = read(pgidPipe[0],p,1);
                          } while (0 < sVar10);
                          if (sVar10 < 0) {
                            sigprocmask(2,(sigset_t *)&old_mask,(sigset_t *)0x0);
                            kwsysProcessCleanupDescriptor(&iStack_200);
                            piVar11 = pgidPipe;
                          }
                          else {
                            kwsysProcessCleanupDescriptor(pgidPipe);
                            iVar1 = sigprocmask(2,(sigset_t *)&old_mask,(sigset_t *)0x0);
                            if (-1 < iVar1) {
                              cp->CommandsLeft = cp->CommandsLeft + 1;
                              uVar14 = 0;
                              lVar5 = 1;
                              while ((uVar14 < 0x400 && (0 < lVar5))) {
                                do {
                                  lVar5 = read(iStack_200,cp->ErrorMessage + uVar14,0x400 - uVar14);
                                  if (-1 < lVar5) break;
                                  piVar11 = __errno_location();
                                } while (*piVar11 == 4);
                                sVar10 = lVar5;
                                if (lVar5 < 1) {
                                  sVar10 = 0;
                                }
                                uVar14 = uVar14 + sVar10;
                              }
                              kwsysProcessCleanupDescriptor(&iStack_200);
                              bVar16 = uVar14 != 0;
                              goto LAB_005343b4;
                            }
                            piVar11 = &iStack_200;
                          }
                          kwsysProcessCleanupDescriptor(piVar11);
                        }
                      }
                    }
                    bVar16 = true;
                  }
                }
LAB_005343b4:
                if (local_20c != *piVar12) {
                  kwsysProcessCleanupDescriptor(&local_20c);
                }
                if (local_208 != *piVar7) {
                  kwsysProcessCleanupDescriptor(&local_208);
                }
                if ((iStack_204 != *p_00) && (cp->MergeOutput == 0)) {
                  kwsysProcessCleanupDescriptor(&iStack_204);
                }
                uVar15 = uVar15 + 1;
                if (bVar16) goto code_r0x0053440c;
              }
              for (lVar5 = 0; lVar5 != 0xc; lVar5 = lVar5 + 4) {
                kwsysProcessCleanupDescriptor((int *)(lVar5 + (long)piVar12));
              }
              if (cp->RealWorkingDirectory != (char *)0x0) {
                do {
                  iVar1 = chdir(cp->RealWorkingDirectory);
                  if (-1 < iVar1) break;
                  piVar12 = __errno_location();
                } while (*piVar12 == 4);
                free(cp->RealWorkingDirectory);
                cp->RealWorkingDirectory = (char *)0x0;
              }
              cp->PipesLeft = 3;
              cp->State = 3;
              cp->Detached = cp->OptionDetach;
              return;
            }
          }
LAB_005344bb:
          kwsysProcessCleanup(cp,1);
          return;
        }
        cp->RealWorkingDirectoryLength = 0x1000;
        pcVar9 = (char *)malloc(0x1000);
        cp->RealWorkingDirectory = pcVar9;
        if (pcVar9 != (char *)0x0) {
          pcVar9 = getcwd(cp->RealWorkingDirectory,(long)cp->RealWorkingDirectoryLength);
          if (pcVar9 != (char *)0x0) {
            do {
              iVar1 = chdir(cp->WorkingDirectory);
              if (-1 < iVar1) goto LAB_00533b9d;
              piVar7 = __errno_location();
            } while (*piVar7 == 4);
          }
          kwsysProcessCleanup(cp,1);
          return;
        }
      }
    }
  }
  builtin_strncpy(cp->ErrorMessage,"Out of memory",0xe);
LAB_00533b81:
  cp->State = 1;
  return;
code_r0x0053440c:
  kwsysProcessCleanupDescriptor(&iStack_200);
  kwsysProcessCleanupDescriptor(&iStack_1fc);
LAB_005344a7:
  if (nextStdIn != *piVar12) {
    kwsysProcessCleanupDescriptor(&nextStdIn);
  }
  goto LAB_005344bb;
  while (piVar12 = __errno_location(), *piVar12 == 4) {
LAB_00534771:
    sVar10 = write(iStack_1fc,p,4);
    if (-1 < sVar10) break;
  }
  _exit(0);
}

Assistant:

void kwsysProcess_Execute(kwsysProcess* cp)
{
  int i;

  /* Do not execute a second copy simultaneously.  */
  if (!cp || cp->State == kwsysProcess_State_Executing) {
    return;
  }

  /* Make sure we have something to run.  */
  if (cp->NumberOfCommands < 1) {
    strcpy(cp->ErrorMessage, "No command");
    cp->State = kwsysProcess_State_Error;
    return;
  }

  /* Initialize the control structure for a new process.  */
  if (!kwsysProcessInitialize(cp)) {
    strcpy(cp->ErrorMessage, "Out of memory");
    cp->State = kwsysProcess_State_Error;
    return;
  }

#if defined(__VMS)
  /* Make sure pipes behave like streams on VMS.  */
  if (!kwsysProcessSetVMSFeature("DECC$STREAM_PIPE", 1)) {
    kwsysProcessCleanup(cp, 1);
    return;
  }
#endif

  /* Save the real working directory of this process and change to
     the working directory for the child processes.  This is needed
     to make pipe file paths evaluate correctly.  */
  if (cp->WorkingDirectory) {
    int r;
    if (!getcwd(cp->RealWorkingDirectory,
                (size_t)(cp->RealWorkingDirectoryLength))) {
      kwsysProcessCleanup(cp, 1);
      return;
    }

    /* Some platforms specify that the chdir call may be
       interrupted.  Repeat the call until it finishes.  */
    while (((r = chdir(cp->WorkingDirectory)) < 0) && (errno == EINTR)) {
    }
    if (r < 0) {
      kwsysProcessCleanup(cp, 1);
      return;
    }
  }

  /* If not running a detached child, add this object to the global
     set of process objects that wish to be notified when a child
     exits.  */
  if (!cp->OptionDetach) {
    if (!kwsysProcessesAdd(cp)) {
      kwsysProcessCleanup(cp, 1);
      return;
    }
  }

  /* Setup the stdin pipe for the first process.  */
  if (cp->PipeFileSTDIN) {
    /* Open a file for the child's stdin to read.  */
    cp->PipeChildStd[0] = open(cp->PipeFileSTDIN, O_RDONLY);
    if (cp->PipeChildStd[0] < 0) {
      kwsysProcessCleanup(cp, 1);
      return;
    }

    /* Set close-on-exec flag on the pipe's end.  */
    if (fcntl(cp->PipeChildStd[0], F_SETFD, FD_CLOEXEC) < 0) {
      kwsysProcessCleanup(cp, 1);
      return;
    }
  } else if (cp->PipeSharedSTDIN) {
    cp->PipeChildStd[0] = 0;
  } else if (cp->PipeNativeSTDIN[0] >= 0) {
    cp->PipeChildStd[0] = cp->PipeNativeSTDIN[0];

    /* Set close-on-exec flag on the pipe's ends.  The read end will
       be dup2-ed into the stdin descriptor after the fork but before
       the exec.  */
    if ((fcntl(cp->PipeNativeSTDIN[0], F_SETFD, FD_CLOEXEC) < 0) ||
        (fcntl(cp->PipeNativeSTDIN[1], F_SETFD, FD_CLOEXEC) < 0)) {
      kwsysProcessCleanup(cp, 1);
      return;
    }
  } else {
    cp->PipeChildStd[0] = -1;
  }

  /* Create the output pipe for the last process.
     We always create this so the pipe can be passed to select even if
     it will report closed immediately.  */
  {
    /* Create the pipe.  */
    int p[2];
    if (pipe(p KWSYSPE_VMS_NONBLOCK) < 0) {
      kwsysProcessCleanup(cp, 1);
      return;
    }

    /* Store the pipe.  */
    cp->PipeReadEnds[KWSYSPE_PIPE_STDOUT] = p[0];
    cp->PipeChildStd[1] = p[1];

    /* Set close-on-exec flag on the pipe's ends.  */
    if ((fcntl(p[0], F_SETFD, FD_CLOEXEC) < 0) ||
        (fcntl(p[1], F_SETFD, FD_CLOEXEC) < 0)) {
      kwsysProcessCleanup(cp, 1);
      return;
    }

    /* Set to non-blocking in case select lies, or for the polling
       implementation.  */
    if (!kwsysProcessSetNonBlocking(p[0])) {
      kwsysProcessCleanup(cp, 1);
      return;
    }
  }

  if (cp->PipeFileSTDOUT) {
    /* Use a file for stdout.  */
    if (!kwsysProcessSetupOutputPipeFile(&cp->PipeChildStd[1],
                                         cp->PipeFileSTDOUT)) {
      kwsysProcessCleanup(cp, 1);
      return;
    }
  } else if (cp->PipeSharedSTDOUT) {
    /* Use the parent stdout.  */
    kwsysProcessCleanupDescriptor(&cp->PipeChildStd[1]);
    cp->PipeChildStd[1] = 1;
  } else if (cp->PipeNativeSTDOUT[1] >= 0) {
    /* Use the given descriptor for stdout.  */
    if (!kwsysProcessSetupOutputPipeNative(&cp->PipeChildStd[1],
                                           cp->PipeNativeSTDOUT)) {
      kwsysProcessCleanup(cp, 1);
      return;
    }
  }

  /* Create stderr pipe to be shared by all processes in the pipeline.
     We always create this so the pipe can be passed to select even if
     it will report closed immediately.  */
  {
    /* Create the pipe.  */
    int p[2];
    if (pipe(p KWSYSPE_VMS_NONBLOCK) < 0) {
      kwsysProcessCleanup(cp, 1);
      return;
    }

    /* Store the pipe.  */
    cp->PipeReadEnds[KWSYSPE_PIPE_STDERR] = p[0];
    cp->PipeChildStd[2] = p[1];

    /* Set close-on-exec flag on the pipe's ends.  */
    if ((fcntl(p[0], F_SETFD, FD_CLOEXEC) < 0) ||
        (fcntl(p[1], F_SETFD, FD_CLOEXEC) < 0)) {
      kwsysProcessCleanup(cp, 1);
      return;
    }

    /* Set to non-blocking in case select lies, or for the polling
       implementation.  */
    if (!kwsysProcessSetNonBlocking(p[0])) {
      kwsysProcessCleanup(cp, 1);
      return;
    }
  }

  if (cp->PipeFileSTDERR) {
    /* Use a file for stderr.  */
    if (!kwsysProcessSetupOutputPipeFile(&cp->PipeChildStd[2],
                                         cp->PipeFileSTDERR)) {
      kwsysProcessCleanup(cp, 1);
      return;
    }
  } else if (cp->PipeSharedSTDERR) {
    /* Use the parent stderr.  */
    kwsysProcessCleanupDescriptor(&cp->PipeChildStd[2]);
    cp->PipeChildStd[2] = 2;
  } else if (cp->PipeNativeSTDERR[1] >= 0) {
    /* Use the given handle for stderr.  */
    if (!kwsysProcessSetupOutputPipeNative(&cp->PipeChildStd[2],
                                           cp->PipeNativeSTDERR)) {
      kwsysProcessCleanup(cp, 1);
      return;
    }
  }

  /* The timeout period starts now.  */
  cp->StartTime = kwsysProcessTimeGetCurrent();
  cp->TimeoutTime.tv_sec = -1;
  cp->TimeoutTime.tv_usec = -1;

  /* Create the pipeline of processes.  */
  {
    kwsysProcessCreateInformation si = { -1, -1, -1, { -1, -1 } };
    int nextStdIn = cp->PipeChildStd[0];
    for (i = 0; i < cp->NumberOfCommands; ++i) {
      /* Setup the process's pipes.  */
      si.StdIn = nextStdIn;
      if (i == cp->NumberOfCommands - 1) {
        nextStdIn = -1;
        si.StdOut = cp->PipeChildStd[1];
      } else {
        /* Create a pipe to sit between the children.  */
        int p[2] = { -1, -1 };
        if (pipe(p KWSYSPE_VMS_NONBLOCK) < 0) {
          if (nextStdIn != cp->PipeChildStd[0]) {
            kwsysProcessCleanupDescriptor(&nextStdIn);
          }
          kwsysProcessCleanup(cp, 1);
          return;
        }

        /* Set close-on-exec flag on the pipe's ends.  */
        if ((fcntl(p[0], F_SETFD, FD_CLOEXEC) < 0) ||
            (fcntl(p[1], F_SETFD, FD_CLOEXEC) < 0)) {
          close(p[0]);
          close(p[1]);
          if (nextStdIn != cp->PipeChildStd[0]) {
            kwsysProcessCleanupDescriptor(&nextStdIn);
          }
          kwsysProcessCleanup(cp, 1);
          return;
        }
        nextStdIn = p[0];
        si.StdOut = p[1];
      }
      si.StdErr = cp->MergeOutput ? cp->PipeChildStd[1] : cp->PipeChildStd[2];

      {
        int res = kwsysProcessCreate(cp, i, &si);

        /* Close our copies of pipes used between children.  */
        if (si.StdIn != cp->PipeChildStd[0]) {
          kwsysProcessCleanupDescriptor(&si.StdIn);
        }
        if (si.StdOut != cp->PipeChildStd[1]) {
          kwsysProcessCleanupDescriptor(&si.StdOut);
        }
        if (si.StdErr != cp->PipeChildStd[2] && !cp->MergeOutput) {
          kwsysProcessCleanupDescriptor(&si.StdErr);
        }

        if (!res) {
          kwsysProcessCleanupDescriptor(&si.ErrorPipe[0]);
          kwsysProcessCleanupDescriptor(&si.ErrorPipe[1]);
          if (nextStdIn != cp->PipeChildStd[0]) {
            kwsysProcessCleanupDescriptor(&nextStdIn);
          }
          kwsysProcessCleanup(cp, 1);
          return;
        }
      }
    }
  }

  /* The parent process does not need the child's pipe ends.  */
  for (i = 0; i < 3; ++i) {
    kwsysProcessCleanupDescriptor(&cp->PipeChildStd[i]);
  }

  /* Restore the working directory. */
  if (cp->RealWorkingDirectory) {
    /* Some platforms specify that the chdir call may be
       interrupted.  Repeat the call until it finishes.  */
    while ((chdir(cp->RealWorkingDirectory) < 0) && (errno == EINTR)) {
    }
    free(cp->RealWorkingDirectory);
    cp->RealWorkingDirectory = 0;
  }

  /* All the pipes are now open.  */
  cp->PipesLeft = KWSYSPE_PIPE_COUNT;

  /* The process has now started.  */
  cp->State = kwsysProcess_State_Executing;
  cp->Detached = cp->OptionDetach;
}